

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O0

void __thiscall MPL::detail::ModelPackageImpl::~ModelPackageImpl(ModelPackageImpl *this)

{
  byte bVar1;
  int iVar2;
  pointer this_00;
  undefined1 local_298 [8];
  error_code ecode;
  ofstream uniquedStream;
  string local_88;
  undefined1 local_68 [8];
  path suffix;
  path uniquedDestination;
  ModelPackageImpl *this_local;
  
  if ((this->m_readOnly & 1U) == 0) {
    std::filesystem::__cxx11::path::path((path *)&suffix._M_cmpts,&this->m_manifestPath);
    generateIdentifier_abi_cxx11_(&local_88,this);
    std::filesystem::__cxx11::path::path((path *)local_68,&local_88,auto_format);
    std::__cxx11::string::~string((string *)&local_88);
    std::filesystem::__cxx11::path::replace_extension((path *)&suffix._M_cmpts);
    std::ofstream::ofstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
              ((ofstream *)&ecode._M_cat,(path *)&suffix._M_cmpts,_S_bin);
    this_00 = std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::operator->(&this->m_manifest)
    ;
    JsonMap::serialize(this_00,(ostream *)&ecode._M_cat);
    std::ofstream::close();
    bVar1 = std::ios::fail();
    if ((bVar1 & 1) == 0) {
      std::error_code::error_code((error_code *)local_298);
      std::filesystem::rename
                ((path *)&suffix._M_cmpts,&this->m_manifestPath,(error_code *)local_298);
      iVar2 = std::error_code::value((error_code *)local_298);
      if (iVar2 != 0) {
        std::filesystem::remove((path *)&suffix._M_cmpts);
      }
    }
    std::ofstream::~ofstream(&ecode._M_cat);
    std::filesystem::__cxx11::path::~path((path *)local_68);
    std::filesystem::__cxx11::path::~path((path *)&suffix._M_cmpts);
  }
  std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr(&this->m_manifest);
  std::filesystem::__cxx11::path::~path(&this->m_packageDataDirPath);
  std::filesystem::__cxx11::path::~path(&this->m_manifestPath);
  std::filesystem::__cxx11::path::~path(&this->m_packagePath);
  return;
}

Assistant:

ModelPackageImpl::~ModelPackageImpl()
{
    if (m_readOnly) {
        return;
    }
    
    std::filesystem::path uniquedDestination(m_manifestPath);
    std::filesystem::path suffix(generateIdentifier()); // std::filesystem::path from stringified UUID
    uniquedDestination.replace_extension(suffix); // unique filename in the presumed writable directory where Manifest.json is sited
    
    std::ofstream uniquedStream(uniquedDestination, std::ios::binary);
    m_manifest->serialize(uniquedStream);
    uniquedStream.close();
    if (uniquedStream.fail()) { // If any of the above fail do not go on to move uniquedDestination to m_manifestPath.
        return;
    }
    
    std::error_code ecode;
    std::filesystem::rename(uniquedDestination, m_manifestPath, ecode); // On failure sets ecode and makes no changes. Does not throw.
    if (ecode.value()) {
        std::filesystem::remove(uniquedDestination);
    }
}